

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O1

bool IsCompileableFile(string *ext)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_);
    if (iVar1 != 0) {
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,".c","");
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,".C","");
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,".cc","");
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,".cpp","");
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,".m","");
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,".mm","");
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_,local_e8,
                 &stack0xffffffffffffffd8,0,&local_e9,&local_ea,&local_eb);
      lVar3 = 0;
      do {
        if (local_38 + lVar3 != *(undefined1 **)((long)local_48 + lVar3)) {
          operator_delete(*(undefined1 **)((long)local_48 + lVar3));
        }
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0xc0);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&IsCompileableFile(std::__cxx11::string_const&)::exts_abi_cxx11_._M_h,ext);
  return cVar2.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool IsCompileableFile(const std::string& ext) {
    static const std::unordered_set<std::string> exts = { ".c", ".C", ".cc", ".cpp", ".m", ".mm" };
    return exts.count(ext) > 0;
}